

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O2

void __thiscall
OpenMD::StringTokenizer::StringTokenizer
          (StringTokenizer *this,string *str,string *delim,bool returnTokens)

{
  pointer pcVar1;
  
  std::__cxx11::string::string((string *)this,(string *)str);
  std::__cxx11::string::string((string *)&this->delim_,(string *)delim);
  this->returnTokens_ = returnTokens;
  pcVar1 = (this->tokenString_)._M_dataplus._M_p;
  (this->currentPos_)._M_current = pcVar1;
  (this->end_)._M_current = pcVar1 + (this->tokenString_)._M_string_length;
  return;
}

Assistant:

StringTokenizer::StringTokenizer(const std::string& str,
                                   const std::string& delim,
                                   bool returnTokens) :
      tokenString_(str),
      delim_(delim), returnTokens_(returnTokens),
      currentPos_(tokenString_.begin()), end_(tokenString_.end()) {}